

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

void __thiscall Application::create_window(Application *this)

{
  GLFWwindow *handle;
  
  glfwInit();
  glfwWindowHint(0x22001,0);
  glfwWindowHint(0x20003,1);
  handle = glfwCreateWindow(0x500,0x2d0,"Vulkan SVO",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  this->m_window = handle;
  glfwSetWindowUserPointer(handle,this);
  glfwSetKeyCallback(this->m_window,glfw_key_callback);
  glfwSetFramebufferSizeCallback(this->m_window,glfw_framebuffer_resize_callback);
  return;
}

Assistant:

void Application::create_window() {
	m_window = myvk::GLFWCreateWindow(kAppName, kDefaultWidth, kDefaultHeight, true);
	glfwSetWindowUserPointer(m_window, this);
	glfwSetKeyCallback(m_window, glfw_key_callback);
	glfwSetFramebufferSizeCallback(m_window, glfw_framebuffer_resize_callback);
}